

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode Curl_rand_hex(Curl_easy *data,uchar *rnd,size_t num)

{
  undefined1 *puVar1;
  uchar **local_c0;
  uchar *bufp;
  uchar buffer [128];
  char *hex;
  ulong uStack_28;
  CURLcode result;
  size_t num_local;
  uchar *rnd_local;
  Curl_easy *data_local;
  
  buffer._120_8_ = anon_var_dwarf_b0a05;
  local_c0 = &bufp;
  if ((num >> 1 < 0x80) && ((num & 1) != 0)) {
    uStack_28 = num - 1;
    data_local._4_4_ = Curl_rand(data,(uchar *)&bufp,uStack_28 >> 1);
    num_local = (size_t)rnd;
    if (data_local._4_4_ == CURLE_OK) {
      for (; uStack_28 != 0; uStack_28 = uStack_28 - 2) {
        puVar1 = (undefined1 *)(num_local + 1);
        *(undefined1 *)num_local =
             *(undefined1 *)(buffer._120_8_ + (long)((int)(*(byte *)local_c0 & 0xf0) >> 4));
        num_local = num_local + 2;
        *puVar1 = *(undefined1 *)(buffer._120_8_ + (long)(int)(*(byte *)local_c0 & 0xf));
        local_c0 = (uchar **)((long)local_c0 + 1);
      }
      *(undefined1 *)num_local = 0;
    }
  }
  else {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_rand_hex(struct Curl_easy *data, unsigned char *rnd,
                       size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;
  const char *hex = "0123456789abcdef";
  unsigned char buffer[128];
  unsigned char *bufp = buffer;
  DEBUGASSERT(num > 1);

#ifdef __clang_analyzer__
  /* This silences a scan-build warning about accesssing this buffer with
     uninitialized memory. */
  memset(buffer, 0, sizeof(buffer));
#endif

  if((num/2 >= sizeof(buffer)) || !(num&1))
    /* make sure it fits in the local buffer and that it is an odd number! */
    return CURLE_BAD_FUNCTION_ARGUMENT;

  num--; /* save one for zero termination */

  result = Curl_rand(data, buffer, num/2);
  if(result)
    return result;

  while(num) {
    *rnd++ = hex[(*bufp & 0xF0)>>4];
    *rnd++ = hex[*bufp & 0x0F];
    bufp++;
    num -= 2;
  }
  *rnd = 0;

  return result;
}